

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O1

void __thiscall
re2::TestInstance::TestInstance
          (TestInstance *this,StringPiece *regexp_str,MatchKind kind,ParseFlags flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  Regexp *this_00;
  Prog *pPVar5;
  ostream *poVar6;
  RE2 *this_01;
  PCRE *this_02;
  long *plVar7;
  size_type *psVar8;
  MatchKind kind_00;
  ParseFlags flags_00;
  ParseFlags flags_01;
  StringPiece *src;
  StringPiece *src_00;
  StringPiece *src_01;
  StringPiece *src_02;
  StringPiece *src_03;
  StringPiece *src_04;
  string re;
  Options options;
  RegexpStatus status;
  string local_248;
  string local_228;
  undefined1 local_208 [4];
  bool bStack_204;
  bool bStack_203;
  bool bStack_202;
  undefined1 uStack_201;
  int local_200;
  undefined4 uStack_1fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  string local_1e8;
  undefined1 local_1c8 [384];
  RegexpStatus local_48;
  
  this->regexp_str_ = regexp_str;
  this->kind_ = kind;
  this->flags_ = flags;
  this->error_ = false;
  this->regexp_ = (Regexp *)0x0;
  this->num_captures_ = 0;
  this->prog_ = (Prog *)0x0;
  this->rprog_ = (Prog *)0x0;
  this->re_ = (PCRE *)0x0;
  this->re2_ = (RE2 *)0x0;
  local_48.code_ = kRegexpSuccess;
  local_48.error_arg_.ptr_ = (char *)0x0;
  local_48.error_arg_.length_ = 0;
  local_48.tmp_ = (string *)0x0;
  this_00 = Regexp::Parse(regexp_str,flags,&local_48);
  this->regexp_ = this_00;
  if (this_00 == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0xb6,0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1c8 + 8),"Cannot parse: ",0xe);
    CEscape_abi_cxx11_(&local_248,(re2 *)this->regexp_str_,src_01);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1c8 + 8),local_248._M_dataplus._M_p,
                        CONCAT44(local_248._M_string_length._4_4_,
                                 (undefined4)local_248._M_string_length));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," mode: ",7);
    FormatMode_abi_cxx11_(&local_228,(re2 *)(ulong)flags,flags_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_228._M_dataplus._M_p,local_228._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
  }
  else {
    iVar3 = Regexp::NumCaptures(this_00);
    this->num_captures_ = iVar3;
    pPVar5 = Regexp::CompileToProg(this->regexp_,0);
    this->prog_ = pPVar5;
    if (pPVar5 != (Prog *)0x0) {
      if (FLAGS_dump_prog == '\x01') {
        LogMessage::LogMessage
                  ((LogMessage *)local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0xc3,0);
        poVar6 = (ostream *)(local_1c8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Prog for ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," regexp ",8);
        CEscape_abi_cxx11_(&local_248,(re2 *)this->regexp_str_,src);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_248._M_dataplus._M_p,
                            CONCAT44(local_248._M_string_length._4_4_,
                                     (undefined4)local_248._M_string_length));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
        FormatKind_abi_cxx11_(&local_228,(re2 *)(ulong)this->kind_,kind_00);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        FormatMode_abi_cxx11_((string *)local_208,(re2 *)(ulong)this->flags_,flags_00);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)CONCAT17(uStack_201,
                                                    CONCAT16(bStack_202,
                                                             CONCAT15(bStack_203,
                                                                      CONCAT14(bStack_204,local_208)
                                                                     ))),
                            CONCAT44(uStack_1fc,local_200));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
        Prog::Dump_abi_cxx11_(&local_1e8,this->prog_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_1e8._M_dataplus._M_p,
                   CONCAT44(local_1e8._M_string_length._4_4_,(undefined4)local_1e8._M_string_length)
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT17(uStack_201,
                             CONCAT16(bStack_202,CONCAT15(bStack_203,CONCAT14(bStack_204,local_208))
                                     ));
        if (paVar1 != &local_1f8) {
          operator_delete(paVar1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        LogMessage::~LogMessage((LogMessage *)local_1c8);
      }
      uVar4 = Engines();
      if ((uVar4 & 0xc) != 0) {
        pPVar5 = Regexp::CompileToReverseProg(this->regexp_,0);
        this->rprog_ = pPVar5;
        if (pPVar5 == (Prog *)0x0) {
          LogMessage::LogMessage
                    ((LogMessage *)local_1c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                     ,0xd0,0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1c8 + 8),"Cannot reverse compile: ",0x18);
          CEscape_abi_cxx11_(&local_248,(re2 *)this->regexp_str_,src_03);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1c8 + 8),local_248._M_dataplus._M_p,
                     CONCAT44(local_248._M_string_length._4_4_,
                              (undefined4)local_248._M_string_length));
          goto LAB_0011b7d2;
        }
        if (FLAGS_dump_rprog == '\x01') {
          LogMessage::LogMessage
                    ((LogMessage *)local_1c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                     ,0xd5,0);
          Prog::Dump_abi_cxx11_(&local_248,this->rprog_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1c8 + 8),local_248._M_dataplus._M_p,
                     CONCAT44(local_248._M_string_length._4_4_,
                              (undefined4)local_248._M_string_length));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p);
          }
          LogMessage::~LogMessage((LogMessage *)local_1c8);
        }
      }
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_248,regexp_str->ptr_,regexp_str->ptr_ + regexp_str->length_);
      if ((flags & OneLine) == NoParseFlags) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,"(?m)",&local_248);
        std::__cxx11::string::operator=((string *)&local_248,(string *)local_1c8);
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_);
        }
      }
      if ((flags & NonGreedy) != NoParseFlags) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,"(?U)",&local_248);
        std::__cxx11::string::operator=((string *)&local_248,(string *)local_1c8);
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_);
        }
      }
      if ((flags & DotNL) != NoParseFlags) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,"(?s)",&local_248);
        std::__cxx11::string::operator=((string *)&local_248,(string *)local_1c8);
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_);
        }
      }
      uVar4 = Engines();
      if ((uVar4 & 0x1c0) == 0) {
LAB_0011b6d2:
        uVar4 = Engines();
        if (((uVar4 >> 9 & 1) != 0) &&
           (bVar2 = Regexp::MimicsPCRE(this->regexp_), bVar2 && this->kind_ != kLongestMatch)) {
          bStack_204 = false;
          bStack_203 = false;
          bStack_202 = false;
          uStack_201 = 0;
          local_200 = 0;
          uStack_1fc._0_1_ = true;
          local_208 = (undefined1  [4])((~flags & 0x20) << 6);
          this_02 = (PCRE *)operator_new(0x50);
          std::operator+(&local_228,"(",&local_248);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_228);
          psVar8 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_1c8._16_8_ = *psVar8;
            local_1c8._24_8_ = plVar7[3];
            local_1c8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_1c8 + 0x10);
          }
          else {
            local_1c8._16_8_ = *psVar8;
            local_1c8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar7;
          }
          local_1c8._8_8_ = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          PCRE::PCRE(this_02,(string *)local_1c8,(PCRE_Options *)local_208);
          this->re_ = this_02;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p);
          }
          if (this->re_->error_->_M_string_length != 0) {
            LogMessage::LogMessage
                      ((LogMessage *)local_1c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                       ,0x106,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1c8 + 8),"Cannot PCRE: ",0xd);
            local_1e8._M_dataplus._M_p = local_248._M_dataplus._M_p;
            local_1e8._M_string_length._0_4_ = (undefined4)local_248._M_string_length;
            CEscape_abi_cxx11_(&local_228,(re2 *)&local_1e8,src_04);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1c8 + 8),local_228._M_dataplus._M_p,
                       local_228._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) goto LAB_0011b5bb;
            goto LAB_0011b5c0;
          }
        }
      }
      else {
        local_208 = (undefined1  [4])0x1;
        bStack_204 = false;
        bStack_202 = true;
        local_200 = 0x800000;
        uStack_1fc._0_1_ = false;
        uStack_1fc._1_3_ = 0;
        local_1f8._M_allocated_capacity = 0x100000000;
        if ((flags & Latin1) != NoParseFlags) {
          local_208 = (undefined1  [4])0x2;
        }
        bStack_203 = this->kind_ == kLongestMatch;
        this_01 = (RE2 *)operator_new(0xe0);
        local_1c8._0_8_ = local_248._M_dataplus._M_p;
        local_1c8._8_4_ = (undefined4)local_248._M_string_length;
        RE2::RE2(this_01,(StringPiece *)local_1c8,(Options *)local_208);
        this->re2_ = this_01;
        if (this_01->error_->_M_string_length == 0) goto LAB_0011b6d2;
        LogMessage::LogMessage
                  ((LogMessage *)local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0xec,0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1c8 + 8),"Cannot RE2: ",0xc);
        local_1e8._M_dataplus._M_p = local_248._M_dataplus._M_p;
        local_1e8._M_string_length._0_4_ = (undefined4)local_248._M_string_length;
        CEscape_abi_cxx11_(&local_228,(re2 *)&local_1e8,src_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1c8 + 8),local_228._M_dataplus._M_p,local_228._M_string_length)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
LAB_0011b5bb:
          operator_delete(local_228._M_dataplus._M_p);
        }
LAB_0011b5c0:
        LogMessage::~LogMessage((LogMessage *)local_1c8);
        this->error_ = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      goto LAB_0011b8ef;
    }
    LogMessage::LogMessage
              ((LogMessage *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0xbe,0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1c8 + 8),"Cannot compile: ",0x10);
    CEscape_abi_cxx11_(&local_248,(re2 *)this->regexp_str_,src_02);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1c8 + 8),local_248._M_dataplus._M_p,
               CONCAT44(local_248._M_string_length._4_4_,(undefined4)local_248._M_string_length));
  }
LAB_0011b7d2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  LogMessage::~LogMessage((LogMessage *)local_1c8);
  this->error_ = true;
LAB_0011b8ef:
  RegexpStatus::~RegexpStatus(&local_48);
  return;
}

Assistant:

TestInstance::TestInstance(const StringPiece& regexp_str, Prog::MatchKind kind,
                           Regexp::ParseFlags flags)
  : regexp_str_(regexp_str),
    kind_(kind),
    flags_(flags),
    error_(false),
    regexp_(NULL),
    num_captures_(0),
    prog_(NULL),
    rprog_(NULL),
    re_(NULL),
    re2_(NULL) {

  VLOG(1) << CEscape(regexp_str);

  // Compile regexp to prog.
  // Always required - needed for backtracking (reference implementation).
  RegexpStatus status;
  regexp_ = Regexp::Parse(regexp_str, flags, &status);
  if (regexp_ == NULL) {
    LOG(INFO) << "Cannot parse: " << CEscape(regexp_str_)
              << " mode: " << FormatMode(flags);
    error_ = true;
    return;
  }
  num_captures_ = regexp_->NumCaptures();
  prog_ = regexp_->CompileToProg(0);
  if (prog_ == NULL) {
    LOG(INFO) << "Cannot compile: " << CEscape(regexp_str_);
    error_ = true;
    return;
  }
  if (FLAGS_dump_prog) {
    LOG(INFO) << "Prog for "
              << " regexp "
              << CEscape(regexp_str_)
              << " (" << FormatKind(kind_)
              << ", " << FormatMode(flags_)
              << ")\n"
              << prog_->Dump();
  }

  // Compile regexp to reversed prog.  Only needed for DFA engines.
  if (Engines() & ((1<<kEngineDFA)|(1<<kEngineDFA1))) {
    rprog_ = regexp_->CompileToReverseProg(0);
    if (rprog_ == NULL) {
      LOG(INFO) << "Cannot reverse compile: " << CEscape(regexp_str_);
      error_ = true;
      return;
    }
    if (FLAGS_dump_rprog)
      LOG(INFO) << rprog_->Dump();
  }

  // Create re string that will be used for RE and RE2.
  string re = regexp_str.as_string();
  // Accomodate flags.
  // Regexp::Latin1 will be accomodated below.
  if (!(flags & Regexp::OneLine))
    re = "(?m)" + re;
  if (flags & Regexp::NonGreedy)
    re = "(?U)" + re;
  if (flags & Regexp::DotNL)
    re = "(?s)" + re;

  // Compile regexp to RE2.
  if (Engines() & ((1<<kEngineRE2)|(1<<kEngineRE2a)|(1<<kEngineRE2b))) {
    RE2::Options options;
    if (flags & Regexp::Latin1)
      options.set_encoding(RE2::Options::EncodingLatin1);
    if (kind_ == Prog::kLongestMatch)
      options.set_longest_match(true);
    re2_ = new RE2(re, options);
    if (!re2_->error().empty()) {
      LOG(INFO) << "Cannot RE2: " << CEscape(re);
      error_ = true;
      return;
    }
  }

  // Compile regexp to RE.
  // PCRE as exposed by the RE interface isn't always usable.
  // 1. It disagrees about handling of empty-string reptitions
  //    like matching (a*)* against "b".  PCRE treats the (a*) as
  //    occurring once, while we treat it as occurring not at all.
  // 2. It treats $ as this weird thing meaning end of string
  //    or before the \n at the end of the string.
  // 3. It doesn't implement POSIX leftmost-longest matching.
  // 4. It lets \s match vertical tab.
  // MimicsPCRE() detects 1 and 2.
  if ((Engines() & (1<<kEnginePCRE)) && regexp_->MimicsPCRE() &&
      kind_ != Prog::kLongestMatch) {
    PCRE_Options o;
    o.set_option(PCRE::UTF8);
    if (flags & Regexp::Latin1)
      o.set_option(PCRE::None);
    // PCRE has interface bug keeping us from finding $0, so
    // add one more layer of parens.
    re_ = new PCRE("("+re+")", o);
    if (!re_->error().empty()) {
      LOG(INFO) << "Cannot PCRE: " << CEscape(re);
      error_ = true;
      return;
    }
  }
}